

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnDate::Append(ColumnDate *this,ColumnRef *column)

{
  element_type *peVar1;
  shared_ptr<clickhouse::ColumnDate> col;
  __shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnDate>((Column *)&stack0xffffffffffffffe0);
  if (local_20 != (_func_int **)0x0) {
    peVar1 = (this->data_).
             super___shared_ptr<clickhouse::ColumnVector<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<clickhouse::ColumnVector<unsigned_short>,void>
              (local_30,(__shared_ptr<clickhouse::ColumnVector<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>
                         *)(local_20 + 5));
    (*(peVar1->super_Column)._vptr_Column[2])(peVar1,local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnDate::Append(ColumnRef column) {
    if (auto col = column->As<ColumnDate>()) {
        data_->Append(col->data_);
    }
}